

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v6::internal::bigint::remove_leading_zeros(bigint *this)

{
  size_t sVar1;
  uint *puVar2;
  buffer<unsigned_int> *in_RDI;
  bool bVar3;
  int num_bigits;
  size_t in_stack_ffffffffffffffd8;
  uint7 in_stack_ffffffffffffffe0;
  int local_c;
  
  sVar1 = buffer<unsigned_int>::size(in_RDI);
  local_c = (int)sVar1;
  do {
    local_c = local_c + -1;
    bVar3 = false;
    if (0 < local_c) {
      puVar2 = buffer<unsigned_int>::operator[](in_RDI,(long)local_c);
      bVar3 = *puVar2 == 0;
    }
  } while (bVar3);
  buffer<unsigned_int>::resize
            ((buffer<unsigned_int> *)(ulong)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void remove_leading_zeros() {
    int num_bigits = static_cast<int>(bigits_.size()) - 1;
    while (num_bigits > 0 && bigits_[num_bigits] == 0) --num_bigits;
    bigits_.resize(num_bigits + 1);
  }